

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astIdentifierReferenceNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t *psVar2;
  sysbvm_tuple_t value;
  sysbvm_tuple_t sVar3;
  undefined1 auStack_a8 [7];
  _Bool isMutable;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_40_5_c7ef10b2 gcFrame;
  sysbvm_astIdentifierReferenceNode_t **referenceNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar2 = arguments + 1;
  gcFrame.errorMessage = (sysbvm_tuple_t)arguments;
  memset(&gcFrameRecord.roots,0,0x28);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_CONTINUE_TARGET;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  _auStack_a8 = (sysbvm_stackFrameRecord_s *)0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*(long *)gcFrame.errorMessage + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)auStack_a8);
  _Var1 = sysbvm_analysisEnvironment_lookSymbolRecursively
                    (context,*psVar2,*(sysbvm_tuple_t *)(*(long *)gcFrame.errorMessage + 0x28),
                     &gcFrame.expansionNode);
  if (_Var1) {
    _Var1 = sysbvm_symbolBinding_isValue(context,gcFrame.expansionNode);
    if (_Var1) {
      _Var1 = sysbvm_tuple_boolean_decode(*(sysbvm_tuple_t *)(gcFrame.expansionNode + 0x40));
      if (!_Var1) {
        sysbvm_stackFrame_popRecord
                  ((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
        sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_a8);
        sVar3 = *(sysbvm_tuple_t *)(*(long *)gcFrame.errorMessage + 0x10);
        value = sysbvm_symbolValueBinding_getValue(gcFrame.expansionNode);
        sVar3 = sysbvm_astLiteralNode_create(context,sVar3,value);
        return sVar3;
      }
    }
    else {
      _Var1 = sysbvm_symbolBinding_isMacroValue(context,gcFrame.expansionNode);
      if (_Var1) {
        gcFrame.analyzedNode =
             (sysbvm_astIdentifierReferenceNode_t *)
             sysbvm_symbolMacroValueBinding_getExpansion(gcFrame.expansionNode);
        sysbvm_stackFrame_popRecord
                  ((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
        sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_a8);
        sVar3 = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                          (context,(sysbvm_tuple_t)gcFrame.analyzedNode,*psVar2);
        return sVar3;
      }
    }
  }
  else {
    gcFrame.binding =
         sysbvm_tuple_printString(context,*(sysbvm_tuple_t *)(*(long *)gcFrame.errorMessage + 0x28))
    ;
    sVar3 = sysbvm_string_createWithCString(context,"Failed to find symbol binding for ");
    gcFrame.symbolString = sysbvm_string_concat(context,sVar3,gcFrame.binding);
    sysbvm_errorWithMessageTuple(gcFrame.symbolString);
  }
  gcFrameRecord.roots =
       (sysbvm_tuple_t *)sysbvm_context_shallowCopy(context,*(sysbvm_tuple_t *)gcFrame.errorMessage)
  ;
  gcFrameRecord.roots[6] = gcFrame.expansionNode;
  sVar3 = sysbvm_symbolBinding_getType(gcFrame.expansionNode);
  gcFrameRecord.roots[4] = sVar3;
  sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,*psVar2);
  gcFrameRecord.roots[3] = sVar3;
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)auStack_a8);
  return (sysbvm_tuple_t)gcFrameRecord.roots;
}

Assistant:

static sysbvm_tuple_t sysbvm_astIdentifierReferenceNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astIdentifierReferenceNode_t **referenceNode = (sysbvm_astIdentifierReferenceNode_t**)node;

    struct {
        sysbvm_astIdentifierReferenceNode_t *analyzedNode;
        sysbvm_tuple_t expansionNode;
        sysbvm_tuple_t binding;
        sysbvm_tuple_t symbolString;
        sysbvm_tuple_t errorMessage;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*referenceNode)->super.sourcePosition);

    // Attempt to replace the symbol with its binding, if it exists.
    if(sysbvm_analysisEnvironment_lookSymbolRecursively(context, *environment, (*referenceNode)->value, &gcFrame.binding))
    {
        if(sysbvm_symbolBinding_isValue(context, gcFrame.binding))
        {
            // Preserve the references into mutable bindings.
            bool isMutable = sysbvm_tuple_boolean_decode(((sysbvm_symbolValueBinding_t*)gcFrame.binding)->isMutable);
            if(!isMutable)
            {
                SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
                SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
                return sysbvm_astLiteralNode_create(context, (*referenceNode)->super.sourcePosition, sysbvm_symbolValueBinding_getValue(gcFrame.binding));
            }
        }
        else if(sysbvm_symbolBinding_isMacroValue(context, gcFrame.binding))
        {
            gcFrame.expansionNode = sysbvm_symbolMacroValueBinding_getExpansion(gcFrame.binding);
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
            return sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.expansionNode, *environment);
        }
    }
    else
    {
        gcFrame.symbolString = sysbvm_tuple_printString(context, (*referenceNode)->value);
        gcFrame.errorMessage = sysbvm_string_concat(context, sysbvm_string_createWithCString(context, "Failed to find symbol binding for "), gcFrame.symbolString);
        sysbvm_errorWithMessageTuple(gcFrame.errorMessage);
    }

    gcFrame.analyzedNode = (sysbvm_astIdentifierReferenceNode_t*)sysbvm_context_shallowCopy(context, (sysbvm_tuple_t)*referenceNode);
    gcFrame.analyzedNode->binding = gcFrame.binding;
    gcFrame.analyzedNode->super.analyzedType = sysbvm_symbolBinding_getType(gcFrame.binding);
    gcFrame.analyzedNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    return (sysbvm_tuple_t)gcFrame.analyzedNode;
}